

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture1DArrayShadowGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float lod;
  float fVar1;
  
  fVar1 = c->in[0].m_data[2];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  lod = computeLodFromGrad1DArray(c);
  fVar1 = texture1DArrayShadowOffset(c,fVar1,s,t,lod,(p->offset).m_data[0]);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture1DArrayShadowGradOffset	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture1DArrayShadowOffset(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad1DArray(c), p.offset.x()); }